

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O2

float_type get_time_step_fdtd(fdtd *fdtd)

{
  if ((ulong)fdtd->type < 3) {
    return *(float_type *)((long)&fdtd->field_1 + (ulong)fdtd->type * 8 + 8);
  }
  fwrite("get_time_step: unknown fdtd type\n",0x21,1,_stderr);
  exit(1);
}

Assistant:

inline float_type get_time_step_fdtd(const struct fdtd *fdtd) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    return fdtd->oneDim.dt;
  case fdtd_two_dims:
    return fdtd->twoDims.dt;
  case fdtd_three_dims:
    return fdtd->threeDims.dt;
  default:
    fprintf(stderr, "get_time_step: unknown fdtd type\n");
    exit(EXIT_FAILURE);
  }
}